

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Class_AST_Node::eval_internal(Class_AST_Node *this,Dispatch_State *t_ss)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Scope_Push_Pop *in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar1;
  Scope_Push_Pop spp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  element_type *peVar2;
  Dispatch_State *in_stack_ffffffffffffff90;
  AST_Node *in_stack_ffffffffffffff98;
  Boxed_Value *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  Dispatch_State *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [64];
  
  peVar2 = in_RDI;
  eval::detail::Scope_Push_Pop::Scope_Push_Pop(in_RSI,(Dispatch_State *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"_current_class_name",&local_41);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 0xc),0);
  std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x26e4ec);
  const_var<std::__cxx11::string>(in_stack_ffffffffffffff58);
  chaiscript::detail::Dispatch_State::add_object
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x26e51f);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 0xc),1);
  std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x26e54e);
  AST_Node::eval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x26e56f);
  Boxed_Value::Boxed_Value((Boxed_Value *)0x26e579);
  eval::detail::Scope_Push_Pop::~Scope_Push_Pop((Scope_Push_Pop *)in_RDI);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

          /// \todo do this better
          // put class name in current scope so it can be looked up by the attrs and methods
          t_ss.add_object("_current_class_name", const_var(children[0]->text));

          children[1]->eval(t_ss);

          return Boxed_Value();
        }